

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::BasicGLSLEarlyFragTests::Cleanup(BasicGLSLEarlyFragTests *this)

{
  int width;
  int height;
  BasicGLSLEarlyFragTests *this_local;
  
  glu::CallLogWrapper::glDisable
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0xb71);
  glu::CallLogWrapper::glClearColor
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0.0,0.0,0.0,0.0);
  glu::CallLogWrapper::glClearDepthf
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1.0);
  width = ShaderImageLoadStoreBase::getWindowWidth(&this->super_ShaderImageLoadStoreBase);
  height = ShaderImageLoadStoreBase::getWindowHeight(&this->super_ShaderImageLoadStoreBase);
  glu::CallLogWrapper::glViewport
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0,0,width,height);
  glu::CallLogWrapper::glDeleteTextures
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,2,this->m_texture);
  glu::CallLogWrapper::glDeleteVertexArrays
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_vao);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_vbo);
  glu::CallLogWrapper::glUseProgram
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_program[0]);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_program[1]);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glDisable(GL_DEPTH_TEST);
		glClearColor(0.0f, 0.0f, 0.0f, 0.0f);
		glClearDepthf(1.0f);
		glViewport(0, 0, getWindowWidth(), getWindowHeight());
		glDeleteTextures(2, m_texture);
		glDeleteVertexArrays(1, &m_vao);
		glDeleteBuffers(1, &m_vbo);
		glUseProgram(0);
		glDeleteProgram(m_program[0]);
		glDeleteProgram(m_program[1]);
		return NO_ERROR;
	}